

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O0

void __thiscall Refal2::CSetBuilder<char>::Reset(CSetBuilder<char> *this)

{
  CSetBuilder<char> *this_local;
  
  this->fullSetStatus = S_Thru;
  std::set<char,_std::less<char>,_std::allocator<char>_>::clear(&this->yes);
  std::set<char,_std::less<char>,_std::allocator<char>_>::clear(&this->no);
  std::set<char,_std::less<char>,_std::allocator<char>_>::clear(&this->thru);
  return;
}

Assistant:

void CSetBuilder<T>::Reset()
{
	fullSetStatus = S_Thru;
	yes.clear();
	no.clear();
	thru.clear();
}